

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# comp_mask_pred_test.cc
# Opt level: O2

void __thiscall
anon_unknown.dwarf_180f112::AV1UpsampledPredTest_DISABLED_Speed_Test::TestBody
          (AV1UpsampledPredTest_DISABLED_Speed_Test *this)

{
  anon_enum_8 aVar1;
  byte bVar2;
  byte bVar3;
  _func_void_macroblockd_ptr_AV1Common_ptr_int_int_mv_ptr_uchar_ptr_int_int_int_int_uchar_ptr_int_int
  *p_Var4;
  upsampled_pred_func p_Var5;
  double dVar6;
  double dVar7;
  ParamType *pPVar8;
  int64_t iVar9;
  uint uVar10;
  long lVar11;
  int j;
  uint uVar12;
  double elapsed_time [2];
  upsampled_pred_func funcs [2];
  aom_usec_timer local_50;
  
  pPVar8 = testing::
           WithParamInterface<std::tuple<void_(*)(macroblockd_*,_const_AV1Common_*,_int,_int,_const_mv_*,_unsigned_char_*,_int,_int,_int,_int,_const_unsigned_char_*,_int,_int),_BLOCK_SIZE>_>
           ::GetParam();
  p_Var4 = (pPVar8->
           super__Tuple_impl<0UL,_void_(*)(macroblockd_*,_const_AV1Common_*,_int,_int,_const_mv_*,_unsigned_char_*,_int,_int,_int,_int,_const_unsigned_char_*,_int,_int),_BLOCK_SIZE>
           ).
           super__Head_base<0UL,_void_(*)(macroblockd_*,_const_AV1Common_*,_int,_int,_const_mv_*,_unsigned_char_*,_int,_int,_int,_int,_const_unsigned_char_*,_int,_int),_false>
           ._M_head_impl;
  pPVar8 = testing::
           WithParamInterface<std::tuple<void_(*)(macroblockd_*,_const_AV1Common_*,_int,_int,_const_mv_*,_unsigned_char_*,_int,_int,_int,_int,_const_unsigned_char_*,_int,_int),_BLOCK_SIZE>_>
           ::GetParam();
  aVar1 = (pPVar8->
          super__Tuple_impl<0UL,_void_(*)(macroblockd_*,_const_AV1Common_*,_int,_int,_const_mv_*,_unsigned_char_*,_int,_int,_int,_int,_const_unsigned_char_*,_int,_int),_BLOCK_SIZE>
          ).super__Tuple_impl<1UL,_BLOCK_SIZE>.super__Head_base<1UL,_BLOCK_SIZE,_false>._M_head_impl
  ;
  bVar2 = ::block_size_wide[aVar1];
  bVar3 = ::block_size_high[aVar1];
  funcs[0] = aom_upsampled_pred_c;
  uVar10 = (uint)(1000000000 / (ulong)((uint)bVar3 + (uint)bVar2));
  elapsed_time[0] = 0.0;
  elapsed_time[1] = 0.0;
  funcs[1] = (upsampled_pred_func)p_Var4;
  for (lVar11 = 0; dVar7 = elapsed_time[1], dVar6 = elapsed_time[0], lVar11 != 2;
      lVar11 = lVar11 + 1) {
    ::aom_usec_timer_start(&local_50);
    p_Var5 = funcs[lVar11];
    for (uVar12 = 0; uVar12 < uVar10; uVar12 = uVar12 + 1) {
      (*p_Var5)((MACROBLOCKD *)0x0,(AV1_COMMON *)0x0,0,0,(MV *)0x0,
                (this->super_AV1UpsampledPredTest).super_AV1CompMaskPredBase.comp_pred1_,(uint)bVar2
                ,(uint)bVar3,3,4,(this->super_AV1UpsampledPredTest).super_AV1CompMaskPredBase.ref_,
                0x80,3);
    }
    ::aom_usec_timer_mark(&local_50);
    iVar9 = ::aom_usec_timer_elapsed(&local_50);
    elapsed_time[lVar11] = ((double)iVar9 * 1000.0) / (double)uVar10;
  }
  printf("UpsampledPred[%d] %3dx%-3d:%7.2f/%7.2fns",1,(ulong)bVar2,(ulong)bVar3);
  printf("(%3.2f)\n",dVar6 / dVar7);
  return;
}

Assistant:

TEST_P(AV1UpsampledPredTest, DISABLED_Speed) {
  RunSpeedTest(GET_PARAM(0), GET_PARAM(1), 1);
}